

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

insert_return_type * __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
::insert(insert_return_type *__return_storage_ptr__,
        raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
        *this,node_type *node)

{
  insert_return_type *piVar1;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  in_R8;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  p;
  pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_bool>
  res;
  pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_bool>
  local_40;
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  *local_28;
  aligned_storage_t<sizeof(slot_type),_alignof(slot_type)> *local_20;
  
  if ((node->
      super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
      ).alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
      super__Optional_payload<std::allocator<int>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<int>_>._M_engaged == false) {
    (__return_storage_ptr__->position).ctrl_ = this->ctrl_ + this->capacity_;
    __return_storage_ptr__->inserted = false;
  }
  else {
    local_20 = &(node->
                super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                ).slot_space_;
    p.second.
    super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    .
    super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
    ._M_head_impl =
         in_R8.
         super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         .
         super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
         ._M_head_impl;
    p.first.
    super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    .
    super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          )(_Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
            )*(_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)((node->
                  super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                  ).slot_space_.data + 8);
    local_28 = this;
    (anonymous_namespace)::StringPolicy::
    apply_impl<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::InsertSlot<false>,std::__cxx11::string_const&,std::tuple<std::__cxx11::string_const&>,void>
              (&local_40,(StringPolicy *)&local_28,
               *(InsertSlot<false> **)
                (node->
                super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                ).slot_space_.data,p);
    if (local_40.second != true) {
      (__return_storage_ptr__->position).ctrl_ = local_40.first.ctrl_;
      (__return_storage_ptr__->position).field_1 = local_40.first.field_1;
      __return_storage_ptr__->inserted = false;
      *(bool *)((long)&(__return_storage_ptr__->node).
                       super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                       .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
                       super__Optional_payload<std::allocator<int>,_true,_false,_false>.
                       super__Optional_payload_base<std::allocator<int>_> + 1) = false;
      piVar1 = (insert_return_type *)
               node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
               ::operator=(&(__return_storage_ptr__->node).
                            super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                           ,&node->
                             super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                          );
      return piVar1;
    }
    if ((node->
        super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
        ).alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
        super__Optional_payload<std::allocator<int>,_true,_false,_false>.
        super__Optional_payload_base<std::allocator<int>_>._M_engaged == false) {
      __assert_fail("alloc_.has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0xb04,
                    "void phmap::priv::node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous namespace)::StringPolicy>, std::allocator<int>>::reset() [PolicyTraits = phmap::priv::hash_policy_traits<phmap::priv::(anonymous namespace)::StringPolicy>, Alloc = std::allocator<int>]"
                   );
    }
    (node->
    super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
    ).alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
    super__Optional_payload<std::allocator<int>,_true,_false,_false>.
    super__Optional_payload_base<std::allocator<int>_>._M_engaged = false;
    (__return_storage_ptr__->position).ctrl_ = local_40.first.ctrl_;
    (__return_storage_ptr__->position).field_1 = local_40.first.field_1;
    __return_storage_ptr__->inserted = true;
  }
  *(bool *)((long)&(__return_storage_ptr__->node).
                   super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                   .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
                   super__Optional_payload<std::allocator<int>,_true,_false,_false>.
                   super__Optional_payload_base<std::allocator<int>_> + 1) = false;
  return (insert_return_type *)0x0;
}

Assistant:

insert_return_type insert(node_type&& node) {
        if (!node) return {end(), false, node_type()};
        const auto& elem = PolicyTraits::element(CommonAccess::GetSlot(node));
        auto res = PolicyTraits::apply(
            InsertSlot<false>{*this, std::move(*CommonAccess::GetSlot(node))},
            elem);
        if (res.second) {
            CommonAccess::Reset(&node);
            return {res.first, true, node_type()};
        } else {
            return {res.first, false, std::move(node)};
        }
    }